

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_add_buffer_Test::TestBody(Buffer_add_buffer_Test *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_type sVar4;
  size_type sVar5;
  char *pcVar6;
  bfy_buffer *buf_00;
  AssertHelper local_320;
  Message local_318;
  size_type local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_4;
  string str;
  Message local_2d0;
  size_t local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_3;
  Message local_2a8;
  size_t local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_2;
  Message local_280;
  int local_278 [2];
  undefined1 local_270 [8];
  AssertionResult gtest_ar_1;
  Message local_258;
  int local_250 [2];
  undefined1 local_248 [8];
  AssertionResult gtest_ar;
  bfy_buffer buf;
  size_type expected_size;
  size_t n_expected_vecs;
  undefined1 local_190 [8];
  BufferWithReadonlyStrings b;
  BufferWithReadonlyStrings a;
  Buffer_add_buffer_Test *this_local;
  
  a.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)
             &b.changes.
              super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_190);
  sVar2 = anon_unknown.dwarf_16b2d::buffer_count_pages
                    ((bfy_buffer *)
                     &b.changes.
                      super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,0xffffffffffffffff);
  sVar3 = anon_unknown.dwarf_16b2d::buffer_count_pages((bfy_buffer *)local_190,0xffffffffffffffff);
  expected_size = sVar2 + sVar3;
  sVar4 = std::size<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &a.buf.changed_coalescing);
  sVar5 = std::size<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &b.buf.changed_coalescing);
  buf._128_8_ = sVar4 + sVar5;
  bfy_buffer_init();
  local_250[1] = 0;
  local_250[0] = bfy_buffer_add_buffer
                           ((bfy_buffer *)&gtest_ar.message_,
                            (bfy_buffer *)
                            &b.changes.
                             super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_248,"0","bfy_buffer_add_buffer(&buf, &a.buf)",local_250 + 1,local_250
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x386,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_278[1] = 0;
  local_278[0] = bfy_buffer_add_buffer((bfy_buffer *)&gtest_ar.message_,(bfy_buffer *)local_190);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_270,"0","bfy_buffer_add_buffer(&buf, &b.buf)",local_278 + 1,local_278
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x387,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_2a0 = bfy_buffer_peek_all((bfy_buffer *)&gtest_ar.message_,(bfy_iovec *)0x0,0);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_298,"n_expected_vecs","bfy_buffer_peek_all(&buf, __null, 0)",
             &expected_size,&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x388,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2c8 = bfy_buffer_get_content_len((bfy_buffer *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_2c0,"expected_size","bfy_buffer_get_content_len(&buf)",
             (unsigned_long *)&buf.changed_coalescing,&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x389,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  (anonymous_namespace)::buffer_remove_string_abi_cxx11_
            ((string *)&gtest_ar_4.message_,(_anonymous_namespace_ *)&gtest_ar.message_,buf_00);
  local_310 = std::size<std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &gtest_ar_4.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_308,"expected_size","std::size(str)",
             (unsigned_long *)&buf.changed_coalescing,&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x38c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  bfy_buffer_destruct((bfy_buffer *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_190);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)
             &b.changes.
              super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Buffer, add_buffer) {
    auto a = BufferWithReadonlyStrings {};
    auto b = BufferWithReadonlyStrings {};
    auto const n_expected_vecs = buffer_count_pages(&a.buf) + buffer_count_pages(&b.buf);
    auto const expected_size = std::size(a.allstrs) + std::size(b.allstrs);

    auto buf = bfy_buffer_init();
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &a.buf));
    EXPECT_EQ(0, bfy_buffer_add_buffer(&buf, &b.buf));
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&buf, NULL, 0));
    EXPECT_EQ(expected_size, bfy_buffer_get_content_len(&buf));

    auto const str = buffer_remove_string(&buf);
    EXPECT_EQ(expected_size, std::size(str));

    bfy_buffer_destruct(&buf);
}